

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_SetPixel(SetPixelForm2 SetPixel)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  code *in_RDI;
  size_t j_1;
  size_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  Image image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffeac;
  uint in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined2 uVar9;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffec0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  Image *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint8_t value;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined4 in_stack_ffffffffffffff08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  ulong local_d0;
  undefined1 local_c1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  undefined1 local_a1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0 [3];
  ImageTemplate<unsigned_char> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  byte local_1;
  
  value = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
  uVar9 = (undefined2)((uint)in_stack_fffffffffffffeb4 >> 0x10);
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffeac);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
             (uint8_t)((ushort)uVar9 >> 8),(uint8_t)uVar9);
  Test_Helper::uniformImage
            (value,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e154b);
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  uVar4 = (ulong)uVar2;
  puVar11 = &local_a1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e157d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (size_type)in_stack_fffffffffffffec8,(allocator_type *)in_stack_fffffffffffffec0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e15a3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_a0);
  puVar10 = &local_c1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1e15c7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (size_type)in_stack_fffffffffffffec8,(allocator_type *)in_stack_fffffffffffffec0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1e15ed);
  local_d0 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_a0);
    if (sVar5 <= local_d0) break;
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_50);
    uVar3 = Test_Helper::randomValue<unsigned_int>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_a0,local_d0)
    ;
    *pvVar6 = uVar3;
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_50);
    uVar3 = Test_Helper::randomValue<unsigned_int>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_c0,local_d0);
    *pvVar6 = uVar3;
    local_d0 = local_d0 + 1;
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  (*local_10)(&local_50,local_a0,&local_c0,*pvVar7);
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  do {
    this = local_d8;
    pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_a0);
    if (pvVar8 <= this) {
      local_1 = 1;
LAB_001e18b9:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x1e18e0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
      return (bool)(local_1 & 1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (local_a0,(size_type)local_d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&local_c0,(size_type)local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
    bVar1 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(uVar2,in_stack_ffffffffffffff08),
                       (uint32_t)((ulong)puVar11 >> 0x20),(uint32_t)puVar11,
                       (uint32_t)(uVar4 >> 0x20),(uint32_t)uVar4,(uint8_t)((ulong)puVar10 >> 0x38));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001e18b9;
    }
    local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &local_d8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )->_M_impl).super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

bool form2_SetPixel(SetPixelForm2 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        std::vector< uint32_t > X( randomValue<uint32_t>( 1, 100 ) );
        std::vector< uint32_t > Y( X.size() );

        for (size_t j = 0; j < X.size(); j++) {
            X[j] = randomValue<uint32_t>( 0, image.width() );
            Y[j] = randomValue<uint32_t>( 0, image.height() );
        }

        SetPixel( image, X, Y, intensity[1] );

        for (size_t j = 0; j < X.size(); j++) {
            if( !verifyImage( image, X[j], Y[j], 1, 1, intensity[1] ) )
                return false;
        }

        return true;
    }